

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyperGraph.h
# Opt level: O2

double __thiscall
HyperGraph::effic_inf_valid_algo(HyperGraph *this,Nodelist *vecSeed,double delta,double eps)

{
  int iVar1;
  vector<bool,_std::allocator<bool>_> *this_00;
  uint uVar2;
  uint *puVar3;
  pointer pvVar4;
  pointer ppVar5;
  long lVar6;
  size_t sVar7;
  int i;
  uint *puVar8;
  pointer ppVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  reference rVar16;
  allocator_type local_81;
  double local_80;
  long local_78;
  HyperGraph *local_70;
  double local_68;
  double dStack_60;
  vector<bool,_std::allocator<bool>_> vecBoolSeed;
  
  local_80 = (eps + 1.0) * 2.8731273138361804;
  local_68 = eps;
  dVar13 = log(2.0 / delta);
  local_68 = (dVar13 * local_80) / (local_68 * local_68) + 1.0;
  std::vector<bool,_std::allocator<bool>_>::vector(&vecBoolSeed,(ulong)this->__numV,&local_81);
  puVar3 = (vecSeed->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar8 = (vecSeed->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start; puVar8 != puVar3; puVar8 = puVar8 + 1) {
    rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[](&vecBoolSeed,(ulong)*puVar8);
    *rVar16._M_p = *rVar16._M_p | rVar16._M_mask;
  }
  this_00 = &this->__vecVisitBool;
  local_80 = 0.0;
  lVar6 = 0;
  local_70 = this;
LAB_0011255c:
  while( true ) {
    auVar14._8_4_ = (int)((ulong)lVar6 >> 0x20);
    auVar14._0_8_ = lVar6;
    auVar14._12_4_ = 0x45300000;
    dStack_60 = auVar14._8_8_ - 1.9342813113834067e+25;
    dVar13 = dStack_60 + ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0);
    if (local_68 <= dVar13) {
      auVar15._0_8_ = (double)CONCAT44(0x43300000,SUB84(local_80,0));
      auVar15._8_4_ = (int)((ulong)local_80 >> 0x20);
      auVar15._12_4_ = 0x45300000;
      local_68 = (dVar13 * (double)this->__numV) /
                 ((auVar15._8_8_ - 1.9342813113834067e+25) + (auVar15._0_8_ - 4503599627370496.0));
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&vecBoolSeed.super__Bvector_base<std::allocator<bool>_>);
      return local_68;
    }
    uVar2 = this->__numV;
    if (0x17d < dsfmt_global_data.idx) {
      dsfmt_gen_rand_all(&dsfmt_global_data);
      dsfmt_global_data.idx = 0;
    }
    uVar12 = (ulong)*(uint *)((long)dsfmt_global_data.status + (long)dsfmt_global_data.idx * 8) %
             (ulong)uVar2;
    dsfmt_global_data.idx = dsfmt_global_data.idx + 1;
    rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[](&vecBoolSeed,uVar12);
    local_80 = (double)((long)local_80 + 1);
    if ((*rVar16._M_p & rVar16._M_mask) == 0) break;
    lVar6 = lVar6 + 1;
  }
  *(this->__vecVisitNode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = (uint)uVar12;
  local_78 = lVar6;
  rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,uVar12);
  uVar10 = 0;
  uVar12 = 1;
LAB_0011260b:
  *rVar16._M_p = *rVar16._M_p | rVar16._M_mask;
LAB_0011260e:
  do {
    if (uVar12 <= uVar10) goto LAB_0011278c;
    uVar2 = (this->__vecVisitNode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar10];
    if (this->_cascadeModel == LT) {
      pvVar4 = (this->_graph->
               super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&pvVar4[uVar2].
                   super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                   ._M_impl.super__Vector_impl_data + 8) !=
          pvVar4[uVar2].
          super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        sVar7 = gen_random_node_by_weight_LT(pvVar4 + uVar2);
        pvVar4 = (this->_graph->
                 super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar6 = *(long *)&pvVar4[uVar2].
                          super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                          ._M_impl.super__Vector_impl_data;
        if ((ulong)((long)*(pointer *)
                           ((long)&pvVar4[uVar2].
                                   super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                   ._M_impl.super__Vector_impl_data + 8) - lVar6 >> 3) <= sVar7)
        goto LAB_0011278c;
        uVar2 = *(uint *)(lVar6 + sVar7 * 8);
        uVar11 = (ulong)uVar2;
        rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,uVar11);
        if ((*rVar16._M_p & rVar16._M_mask) != 0) goto LAB_0011278c;
        rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[](&vecBoolSeed,uVar11);
        if ((*rVar16._M_p & rVar16._M_mask) != 0) {
          local_78 = local_78 + 1;
          goto LAB_0011278c;
        }
        (this->__vecVisitNode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar12] = uVar2;
        rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,uVar11);
        uVar10 = uVar10 + 1;
        uVar12 = uVar12 + 1;
        goto LAB_0011260b;
      }
    }
    else if (this->_cascadeModel == IC) break;
    uVar10 = uVar10 + 1;
  } while( true );
  pvVar4 = (this->_graph->
           super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppVar9 = pvVar4[uVar2].
           super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar5 = *(pointer *)
            ((long)&pvVar4[uVar2].
                    super__Vector_base<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                    ._M_impl.super__Vector_impl_data + 8);
  uVar10 = uVar10 + 1;
LAB_00112666:
  this = local_70;
  if (ppVar9 == ppVar5) goto LAB_0011260e;
  uVar2 = ppVar9->first;
  uVar11 = (ulong)uVar2;
  rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,uVar11);
  if ((*rVar16._M_p & rVar16._M_mask) == 0) {
    if (0x17d < dsfmt_global_data.idx) {
      dsfmt_gen_rand_all(&dsfmt_global_data);
      dsfmt_global_data.idx = 0;
    }
    iVar1 = dsfmt_global_data.idx + 1;
    lVar6 = (long)dsfmt_global_data.idx;
    dsfmt_global_data.idx = iVar1;
    if (2.0 - dsfmt_global_data.status[0].d[lVar6] <= (double)ppVar9->second) {
      rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[](&vecBoolSeed,uVar11);
      if ((*rVar16._M_p & rVar16._M_mask) != 0) {
        local_78 = local_78 + 1;
        this = local_70;
LAB_0011278c:
        for (uVar10 = 0; lVar6 = local_78, uVar12 != uVar10; uVar10 = uVar10 + 1) {
          rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             (this_00,(ulong)(this->__vecVisitNode).
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_start[uVar10]);
          *rVar16._M_p = *rVar16._M_p & ~rVar16._M_mask;
        }
        goto LAB_0011255c;
      }
      (local_70->__vecVisitNode).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar12] = uVar2;
      rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,uVar11);
      uVar12 = uVar12 + 1;
      *rVar16._M_p = *rVar16._M_p | rVar16._M_mask;
    }
  }
  ppVar9 = ppVar9 + 1;
  goto LAB_00112666;
}

Assistant:

double effic_inf_valid_algo(const Nodelist& vecSeed, const double delta = 1e-3, const double eps = 0.01)
    {
        const double c = 2.0 * (exp(1.0) - 2.0);
        const double LambdaL = 1.0 + 2.0 * c * (1.0 + eps) * log(2.0 / delta) / (eps * eps);
        size_t numHyperEdge = 0;
        size_t numCoverd = 0;
        std::vector<bool> vecBoolSeed(__numV);
        for (auto seed : vecSeed) vecBoolSeed[seed] = true;

        while (numCoverd < LambdaL)
        {
            numHyperEdge++;
            size_t numVisitNode = 0, currIdx = 0;
            const auto uStart = dsfmt_gv_genrand_uint32_range(__numV);
            if (vecBoolSeed[uStart])
            {
                // Stop, this sample is covered
                numCoverd++;
                continue;
            }
            __vecVisitNode[numVisitNode++] = uStart;
            __vecVisitBool[uStart] = true;
            while (currIdx < numVisitNode)
            {
                const auto expand = __vecVisitNode[currIdx++];
                if (_cascadeModel == IC)
                {
                    for (auto& nbr : _graph[expand])
                    {
                        const auto nbrId = nbr.first;
                        if (__vecVisitBool[nbrId])
                            continue;
                        const auto randDouble = dsfmt_gv_genrand_open_close();
                        if (randDouble > nbr.second)
                            continue;
                        if (vecBoolSeed[nbrId])
                        {
                            // Stop, this sample is covered
                            numCoverd++;
                            goto postProcess;
                        }
                        __vecVisitNode[numVisitNode++] = nbrId;
                        __vecVisitBool[nbrId] = true;
                    }
                }
                else if (_cascadeModel == LT)
                {
                    if (_graph[expand].size() == 0)
                        continue;
                    const auto nextNbrIdx = gen_random_node_by_weight_LT(_graph[expand]);
                    if (nextNbrIdx >= _graph[expand].size()) break; // No element activated
                    const auto nbrId = _graph[expand][nextNbrIdx].first;
                    if (__vecVisitBool[nbrId]) break; // Stop, no further node activated
                    if (vecBoolSeed[nbrId])
                    {
                        // Stop, this sample is covered
                        numCoverd++;
                        goto postProcess;
                    }
                    __vecVisitNode[numVisitNode++] = nbrId;
                    __vecVisitBool[nbrId] = true;
                }
            }
            postProcess:
            for (auto i = 0; i < numVisitNode; i++)
                __vecVisitBool[__vecVisitNode[i]] = false;
        }
        return 1.0 * numCoverd * __numV / numHyperEdge;
    }